

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconstruction.cpp
# Opt level: O0

void lts2::BinaryReconstructionWithBIHT
               (Mat *X,LBDOperator *LBD,Mat *binaryDescriptor,int iterations,float sparsityCoeff,
               Size *patchSize,float patchMean,int norm,string *wavelet)

{
  LBDOperator *pLVar1;
  int iVar2;
  _InputArray *p_Var3;
  ostream *poVar4;
  float fVar5;
  double dVar6;
  undefined1 auVar7 [12];
  double local_498;
  int local_48c;
  _InputOutputArray local_478;
  _InputArray local_460;
  _InputArray local_448;
  float local_42c;
  double dStack_428;
  float norm_x;
  _OutputArray local_420;
  _InputArray local_408;
  _InputArray local_3f0;
  _OutputArray local_3d8;
  _InputArray local_3c0;
  _InputArray local_3a8;
  double local_390;
  int local_388;
  bool local_381;
  int iter;
  bool hasConverged;
  _InputArray local_378;
  float local_35c;
  undefined1 local_358 [4];
  float norm_x_1;
  _InputArray local_338;
  Size_<int> local_320;
  undefined1 local_318 [8];
  SignOperator A;
  Mat local_2f8 [96];
  Mat local_298 [8];
  Mat C0;
  Scalar_<double> local_238;
  _InputArray local_218;
  Size_<int> local_1fc;
  int local_1f4;
  int local_1f0;
  int wh;
  int ww;
  int fsize;
  double *Q;
  double *P;
  Mat nablaJ;
  Mat local_178 [8];
  Mat Ax;
  undefined1 local_118 [8];
  Mat X_im;
  Scalar_<double> local_b8;
  _InputArray local_98;
  Size_<int> local_80;
  int local_78;
  float local_74;
  int K;
  float tau;
  int M;
  allocator local_59;
  string local_58 [32];
  int local_38;
  float local_34;
  int norm_local;
  float patchMean_local;
  Size *patchSize_local;
  float sparsityCoeff_local;
  int iterations_local;
  Mat *binaryDescriptor_local;
  LBDOperator *LBD_local;
  Mat *X_local;
  
  local_38 = norm;
  local_34 = patchMean;
  _norm_local = patchSize;
  patchSize_local._4_4_ = iterations;
  _sparsityCoeff_local = binaryDescriptor;
  binaryDescriptor_local = (Mat *)LBD;
  LBD_local = (LBDOperator *)X;
  if ((norm != 2) && (norm != 4)) {
    patchSize_local._0_4_ = sparsityCoeff;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,"norm == cv::NORM_L1 || norm == cv::NORM_L2",&local_59);
    auVar7 = cv::error(-0xd7,local_58,"BinaryReconstructionWithBIHT",
                       "/workspace/llm4binary/github/license_c_cmakelists/sansuiso[P]LBDReconstruction/src/LBDReconstruction/reconstruction.cpp"
                       ,0x167);
    tau = auVar7._8_4_;
    _M = auVar7._0_8_;
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    _Unwind_Resume(_M);
  }
  if (*(int *)(binaryDescriptor + 8) < *(int *)(binaryDescriptor + 0xc)) {
    local_48c = *(int *)(binaryDescriptor + 0xc);
  }
  else {
    local_48c = *(int *)(binaryDescriptor + 8);
  }
  K = local_48c;
  local_74 = 1.0 / (float)local_48c;
  if (sparsityCoeff <= 1.0) {
    local_498 = (double)sparsityCoeff;
  }
  else {
    local_498 = 1.0;
  }
  if (0.0 <= local_498) {
    if (1.0 < sparsityCoeff) {
      sparsityCoeff = 1.0;
    }
  }
  else {
    sparsityCoeff = 0.0;
  }
  patchSize_local._0_4_ = sparsityCoeff;
  iVar2 = cv::Size_<int>::area(patchSize);
  fVar5 = rintf(sparsityCoeff * (float)iVar2);
  pLVar1 = LBD_local;
  local_78 = (int)fVar5;
  cv::Size_<int>::Size_(&local_80,patchSize);
  cv::Mat::create(pLVar1,&local_80,5);
  pLVar1 = LBD_local;
  cv::Scalar_<double>::Scalar_(&local_b8,0.0);
  cv::_InputArray::_InputArray<double,4,1>(&local_98,(Matx<double,_4,_1> *)&local_b8);
  cv::noArray();
  cv::Mat::setTo((_InputArray *)pLVar1,&local_98);
  cv::_InputArray::~_InputArray(&local_98);
  cv::Mat::Mat((Mat *)local_118);
  cv::Mat::Mat(local_178);
  cv::Mat::Mat((Mat *)&P);
  Q = (double *)0x0;
  _ww = (double *)0x0;
  wh = 0;
  WaveletCoef(wavelet,&Q,(double **)&ww,&wh);
  cv::Size_<int>::Size_(&local_1fc,patchSize);
  cv::Mat::create(local_118,&local_1fc,5);
  cv::Scalar_<double>::Scalar_(&local_238,(double)local_34);
  cv::_InputArray::_InputArray<double,4,1>(&local_218,(Matx<double,_4,_1> *)&local_238);
  cv::noArray();
  cv::Mat::setTo((_InputArray *)local_118,&local_218);
  cv::_InputArray::~_InputArray(&local_218);
  WaveletTransform2D((Mat *)local_118,(Mat *)LBD_local,Q,_ww,wh,&local_1f0,&local_1f4,-1);
  pLVar1 = LBD_local;
  cv::Rect_<int>::Rect_((Rect_<int> *)&A.super_LinearOperator._norm,0,0,local_1f0,local_1f4);
  cv::Mat::operator()(local_2f8,(Rect *)pLVar1);
  cv::Mat::clone();
  cv::Mat::~Mat(local_2f8);
  InverseWaveletTransform2D((Mat *)LBD_local,(Mat *)local_118,Q,_ww,wh,&local_1f0,&local_1f4);
  SignOperator::SignOperator((SignOperator *)local_318);
  pLVar1 = LBD_local;
  cv::Size_<int>::Size_(&local_320,patchSize);
  cv::Mat::create(pLVar1,&local_320,5);
  pLVar1 = LBD_local;
  cv::Scalar_<double>::Scalar_((Scalar_<double> *)local_358,0.0);
  cv::_InputArray::_InputArray<double,4,1>(&local_338,(Matx<double,_4,_1> *)local_358);
  cv::noArray();
  cv::Mat::setTo((_InputArray *)pLVar1,&local_338);
  cv::_InputArray::~_InputArray(&local_338);
  if (local_38 == 4) {
    (**(code **)(*(long *)binaryDescriptor_local + 0x18))
              (binaryDescriptor_local,_sparsityCoeff_local,local_118);
    WaveletTransform2D((Mat *)local_118,(Mat *)LBD_local,Q,_ww,wh,&local_1f0,&local_1f4,-1);
    cv::_InputArray::_InputArray(&local_378,(Mat *)LBD_local);
    p_Var3 = (_InputArray *)cv::noArray();
    dVar6 = (double)cv::norm(&local_378,4,p_Var3);
    fVar5 = (float)dVar6;
    cv::_InputArray::~_InputArray(&local_378);
    local_35c = fVar5;
    if (0.0 < fVar5) {
      _iter = (double)fVar5;
      cv::operator/=((Mat *)LBD_local,(double *)&iter);
    }
  }
  local_388 = 0;
  local_381 = false;
  while (((local_381 ^ 0xffU) & 1) != 0) {
    InverseWaveletTransform2D((Mat *)LBD_local,(Mat *)local_118,Q,_ww,wh,&local_1f0,&local_1f4);
    (**(code **)(*(long *)binaryDescriptor_local + 0x10))
              (binaryDescriptor_local,local_118,local_178);
    if (local_38 == 2) {
      cv::operator-=(local_178,_sparsityCoeff_local);
      (**(code **)(*(long *)binaryDescriptor_local + 0x18))
                (binaryDescriptor_local,local_178,local_118);
      WaveletTransform2D((Mat *)local_118,(Mat *)&P,Q,_ww,wh,&local_1f0,&local_1f4,-1);
      local_390 = (double)local_74 * 0.5;
      cv::operator*=((Mat *)&P,&local_390);
    }
    else {
      cv::_InputArray::_InputArray(&local_3a8,local_178);
      cv::_InputArray::_InputArray(&local_3c0,_sparsityCoeff_local);
      cv::_OutputArray::_OutputArray(&local_3d8,local_178);
      cv::multiply(&local_3a8,&local_3c0,&local_3d8,1.0,-1);
      cv::_OutputArray::~_OutputArray(&local_3d8);
      cv::_InputArray::~_InputArray(&local_3c0);
      cv::_InputArray::~_InputArray(&local_3a8);
      ExtractTheNegativePart(local_178,local_178);
      cv::_InputArray::_InputArray(&local_3f0,local_178);
      cv::_InputArray::_InputArray(&local_408,_sparsityCoeff_local);
      cv::_OutputArray::_OutputArray(&local_420,local_178);
      cv::multiply(&local_3f0,&local_408,&local_420,1.0,-1);
      cv::_OutputArray::~_OutputArray(&local_420);
      cv::_InputArray::~_InputArray(&local_408);
      cv::_InputArray::~_InputArray(&local_3f0);
      (**(code **)(*(long *)binaryDescriptor_local + 0x18))
                (binaryDescriptor_local,local_178,local_118);
      WaveletTransform2D((Mat *)local_118,(Mat *)&P,Q,_ww,wh,&local_1f0,&local_1f4,-1);
      dStack_428 = (double)local_74;
      cv::operator*=((Mat *)&P,&stack0xfffffffffffffbd8);
    }
    cv::operator-=((Mat *)LBD_local,(Mat *)&P);
    ProxL0((Mat *)LBD_local,local_78);
    InverseWaveletTransform2D((Mat *)LBD_local,(Mat *)local_118,Q,_ww,wh,&local_1f0,&local_1f4);
    ProxRangeConstraint((Mat *)local_118,0.0,1.0);
    ProxMeanConstraint((Mat *)local_118,local_34);
    local_388 = local_388 + 1;
    local_381 = patchSize_local._4_4_ <= local_388;
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"Stopped after ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_388);
  poVar4 = std::operator<<(poVar4," iterations ");
  poVar4 = std::operator<<(poVar4," (max allowed was ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,patchSize_local._4_4_);
  poVar4 = std::operator<<(poVar4,")");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  cv::_InputArray::_InputArray(&local_448,(Mat *)LBD_local);
  p_Var3 = (_InputArray *)cv::noArray();
  dVar6 = (double)cv::norm(&local_448,4,p_Var3);
  cv::_InputArray::~_InputArray(&local_448);
  local_42c = (float)dVar6;
  InverseWaveletTransform2D((Mat *)LBD_local,(Mat *)local_118,Q,_ww,wh,&local_1f0,&local_1f4);
  cv::_InputArray::_InputArray(&local_460,(Mat *)local_118);
  cv::_InputOutputArray::_InputOutputArray(&local_478,(Mat *)LBD_local);
  p_Var3 = (_InputArray *)cv::noArray();
  cv::normalize(&local_460,&local_478,0.0,1.0,0x20,-1,p_Var3);
  cv::_InputOutputArray::~_InputOutputArray(&local_478);
  cv::_InputArray::~_InputArray(&local_460);
  if (Q != (double *)0x0) {
    operator_delete__(Q);
  }
  if (_ww != (double *)0x0) {
    operator_delete__(_ww);
  }
  SignOperator::~SignOperator((SignOperator *)local_318);
  cv::Mat::~Mat(local_298);
  cv::Mat::~Mat((Mat *)&P);
  cv::Mat::~Mat(local_178);
  cv::Mat::~Mat((Mat *)local_118);
  return;
}

Assistant:

void lts2::BinaryReconstructionWithBIHT(cv::Mat &X, LBDOperator &LBD, cv::Mat const &binaryDescriptor,
                                        int iterations, float sparsityCoeff, cv::Size patchSize, float patchMean,
                                        int norm, std::string const &wavelet)
{
  CV_Assert(norm == cv::NORM_L1 || norm == cv::NORM_L2);

  int const M = MAX(binaryDescriptor.rows, binaryDescriptor.cols);
  float const tau = 1.0 / (float)M;

  sparsityCoeff = MAX(MIN(sparsityCoeff, 1.0), 0.0);
  int const K = (int)rintf( sparsityCoeff*patchSize.area() );

  X.create(patchSize, CV_32FC1);
  X.setTo(cv::Scalar(0.0));

  cv::Mat X_im;
  cv::Mat Ax;
  cv::Mat nablaJ;

  // Wavelet basis
  double *P = NULL, *Q = NULL;
  int fsize = 0, ww, wh;
  lts2::WaveletCoef(wavelet, &P, &Q, &fsize);

  X_im.create(patchSize, CV_32F);
  X_im.setTo(cv::Scalar(patchMean));
  lts2::WaveletTransform2D(X_im, X, P, Q, fsize, &ww, &wh);
  cv::Mat C0 = X(cv::Rect(0,0,ww,wh)).clone();
  lts2::InverseWaveletTransform2D(X, X_im, P, Q, fsize, &ww, &wh);

  // Operators
  SignOperator A;

  // Special init if norm = L2
  X.create(patchSize, CV_32FC1);
  X.setTo(cv::Scalar(0.0));
  if (norm == cv::NORM_L2)
  {
    LBD.ApplyConjugate(binaryDescriptor, X_im);
    lts2::WaveletTransform2D(X_im, X, P, Q, fsize, &ww, &wh);
    float norm_x = cv::norm(X);
    if (norm_x > 0.0) X /= norm_x;
  }

  bool hasConverged = false;
  int iter = 0;

  while (!hasConverged)
  {
    // Back from the wavelet world
    lts2::InverseWaveletTransform2D(X, X_im, P, Q, fsize, &ww, &wh);
    LBD.Apply(X_im, Ax);

    // Step 1a : gradient
    if (norm == cv::NORM_L1)
    {
      Ax -= binaryDescriptor;

      LBD.ApplyConjugate(Ax, X_im);
      lts2::WaveletTransform2D(X_im, nablaJ, P, Q, fsize, &ww, &wh);
      nablaJ *= (0.5*tau);
    }
    else
    {
      cv::multiply(Ax, binaryDescriptor, Ax);
      ExtractTheNegativePart(Ax, Ax);

      cv::multiply(Ax, binaryDescriptor, Ax);
      LBD.ApplyConjugate(Ax, X_im);
      lts2::WaveletTransform2D(X_im, nablaJ, P, Q, fsize, &ww, &wh);

      nablaJ *= tau;
    }

    // Step 1b : update estimate
    X -= nablaJ;

    // Step 2 : enforce sparsity
    lts2::ProxL0(X, K);
    lts2::InverseWaveletTransform2D(X, X_im, P, Q, fsize, &ww, &wh);
    lts2::ProxRangeConstraint(X_im, 0.0, 1.0);
    lts2::ProxMeanConstraint(X_im, patchMean);

    // Termination criterion
    hasConverged = (++iter >= iterations);  // Iterations count limit
  }

#ifdef DEBUG
  std::cout << "Stopped after " << iter << " iterations " << " (max allowed was " << iterations << ")" << std::endl;
#endif

  // Normalize by projecting to the sphere
  float norm_x = cv::norm(X);
//  if (norm_x < LTS2_EPSILON)
//    norm_x = 1.0
//  X /= norm_x;

  lts2::InverseWaveletTransform2D(X, X_im, P, Q, fsize, &ww, &wh);
  cv::normalize(X_im, X, 0.0, 1.0, cv::NORM_MINMAX);

  // Cleanup
  delete[] P;
  delete[] Q;
}